

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastFullAdder(Gia_Man_t *pNew,int a,int b,int c,int *pc,int *ps)

{
  uint iLit0;
  uint uVar1;
  uint iLit1;
  int iVar2;
  
  iLit0 = Gia_ManHashAnd(pNew,a,b);
  if ((-1 < a) && (-1 < b)) {
    uVar1 = Gia_ManHashAnd(pNew,a ^ 1,b ^ 1);
    if ((-1 < (int)iLit0) && (-1 < (int)uVar1)) {
      uVar1 = Gia_ManHashAnd(pNew,iLit0 ^ 1,uVar1 ^ 1);
      iLit1 = Gia_ManHashAnd(pNew,c,uVar1);
      if ((-1 < c) && (-1 < (int)uVar1)) {
        uVar1 = Gia_ManHashAnd(pNew,c ^ 1,uVar1 ^ 1);
        if ((-1 < (int)iLit1) && (-1 < (int)uVar1)) {
          iVar2 = Gia_ManHashAnd(pNew,iLit1 ^ 1,uVar1 ^ 1);
          *ps = iVar2;
          iVar2 = Gia_ManHashOr(pNew,iLit0,iLit1);
          *pc = iVar2;
          return;
        }
      }
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf4,"int Abc_LitNot(int)");
}

Assistant:

void Wlc_BlastFullAdder( Gia_Man_t * pNew, int a, int b, int c, int * pc, int * ps )
{
    int fUseXor = 0;
    if ( fUseXor )
    {
        int Xor  = Gia_ManHashXor(pNew, a, b);
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        *ps      = Gia_ManHashXor(pNew, c, Xor);
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
    else
    {
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And1_= Gia_ManHashAnd(pNew, Abc_LitNot(a), Abc_LitNot(b));
        int Xor  = Gia_ManHashAnd(pNew, Abc_LitNot(And1), Abc_LitNot(And1_));
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        int And2_= Gia_ManHashAnd(pNew, Abc_LitNot(c), Abc_LitNot(Xor));
        *ps      = Gia_ManHashAnd(pNew, Abc_LitNot(And2), Abc_LitNot(And2_));
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
}